

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

bool anon_unknown.dwarf_cd21::try_to_run(Workitem *w)

{
  bool bVar1;
  
  bVar1 = depspawn::internal::TaskPool::try_run(depspawn::internal::TP);
  return bVar1;
}

Assistant:

bool try_to_run(Workitem * w)
  {
#ifdef DEPSPAWN_USE_TBB
    bool success = false;
    if ( w->status == Workitem::Status_t::Ready ) {
      AbstractBoxedFunction * const stolen_abf = w->steal();
      if (stolen_abf != nullptr) {
        ObserversAtWork.fetch_sub(1);
        success = true;
        stolen_abf->run_in_env(true);
        delete stolen_abf;
      }
    }
    return success;
#else
    return TP->try_run(); // By now we just try to run the oldest pending task
#endif
  }